

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::CleanupParseStack
          (Parse<SGParser::ParseStackGenericElement> *this,size_t tillPos)

{
  size_t markerIndex;
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = this->StackPosition;
  uVar2 = sVar1 << 6 | 8;
  for (; tillPos < sVar1; sVar1 = sVar1 - 1) {
    markerIndex = *(size_t *)
                   ((long)&(this->pStack->super_ParseStackElement<SGParser::GenericToken>).State +
                   uVar2);
    if (markerIndex != 0xffffffffffffffff) {
      BacktrackingTokenStream<SGParser::GenericToken>::ReleaseMarker(&this->Stream,markerIndex);
    }
    uVar2 = uVar2 - 0x40;
  }
  this->StackPosition = tillPos;
  return;
}

Assistant:

void Parse<StackElement>::CleanupParseStack(size_t tillPos) {
    // Call the destroy function for all stack elements (except 0 - special element)
    for (auto i = StackPosition; i > tillPos; --i) {
        if (pStack[i].TerminalMarker != InvalidIndex)
            Stream.ReleaseMarker(pStack[i].TerminalMarker);
        pStack[i].Cleanup();
    }
    // And reset position to last 'valid' element - usually 0
    StackPosition = tillPos;
}